

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O0

void __thiscall icu_63::TransliteratorSpec::setupNext(TransliteratorSpec *this)

{
  uint uVar1;
  __off_t in_RDX;
  __off_t __length;
  int32_t i;
  TransliteratorSpec *this_local;
  
  this->isNextLocale = '\0';
  if (this->isSpecLocale == '\0') {
    icu_63::UnicodeString::truncate(&this->nextSpec,(char *)0x0,in_RDX);
  }
  else {
    icu_63::UnicodeString::operator=(&this->nextSpec,&this->spec);
    uVar1 = icu_63::UnicodeString::lastIndexOf(&this->nextSpec,L'_');
    if ((int)uVar1 < 1) {
      icu_63::UnicodeString::operator=(&this->nextSpec,&this->scriptName);
    }
    else {
      icu_63::UnicodeString::truncate(&this->nextSpec,(char *)(ulong)uVar1,__length);
      this->isNextLocale = '\x01';
    }
  }
  return;
}

Assistant:

void TransliteratorSpec::setupNext() {
    isNextLocale = FALSE;
    if (isSpecLocale) {
        nextSpec = spec;
        int32_t i = nextSpec.lastIndexOf(LOCALE_SEP);
        // If i == 0 then we have _FOO, so we fall through
        // to the scriptName.
        if (i > 0) {
            nextSpec.truncate(i);
            isNextLocale = TRUE;
        } else {
            nextSpec = scriptName; // scriptName may be empty
        }
    } else {
        // spec is a script, so we are at the end
        nextSpec.truncate(0);
    }
}